

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

void highbd_interpolate(uint16_t *input,int in_length,uint16_t *output,int out_length,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint16_t uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  int16_t (*local_48) [8];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined2 uVar27;
  
  if (out_length < in_length) {
    iVar8 = out_length * 0x10;
    if (iVar8 < in_length * 0xd) {
      if (iVar8 < in_length * 0xb) {
        local_48 = filteredinterp_filters625;
        if (SBORROW4(iVar8,in_length * 9) != iVar8 + in_length * -9 < 0) {
          local_48 = filteredinterp_filters500;
        }
      }
      else {
        local_48 = filteredinterp_filters750;
      }
    }
    else {
      local_48 = filteredinterp_filters875;
    }
  }
  else {
    local_48 = av1_resize_filter_normative;
  }
  iVar15 = out_length / 2;
  iVar18 = 0;
  uVar13 = (uint)(in_length * 0x4000 + iVar15) / (uint)out_length;
  iVar8 = -iVar15;
  if (in_length - out_length != 0 && out_length <= in_length) {
    iVar8 = iVar15;
  }
  iVar8 = ((in_length - out_length) * 0x2000 + iVar8) / out_length;
  uVar10 = iVar8 + 0x80;
  if (iVar8 < 0xbf80) {
    iVar18 = 0;
    uVar16 = uVar10;
    do {
      iVar18 = iVar18 + 1;
      uVar16 = uVar16 + uVar13;
    } while ((int)uVar16 < 0xc000);
  }
  iVar15 = out_length + -1;
  for (iVar8 = iVar8 + uVar13 * iVar15 + 0x80; in_length <= (iVar8 >> 0xe) + 4;
      iVar8 = iVar8 - uVar13) {
    iVar15 = iVar15 + -1;
  }
  if (iVar15 < iVar18) {
    if (0 < out_length) {
      iVar8 = 0;
      do {
        lVar12 = 0;
        iVar18 = 0;
        do {
          uVar16 = ((int)uVar10 >> 0xe) + -3 + (int)lVar12;
          if ((int)(in_length - 1U) <= (int)uVar16) {
            uVar16 = in_length - 1U;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          iVar18 = iVar18 + (uint)input[uVar16] *
                            (int)*(short *)((long)*local_48 +
                                           lVar12 * 2 + (ulong)(uVar10 >> 4 & 0x3f0));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 8);
        uVar16 = iVar18 + 0x40 >> 7;
        if (bd == 10) {
          uVar17 = 0x3ff;
        }
        else if (bd == 0xc) {
          uVar17 = 0xfff;
        }
        else {
          uVar17 = 0xff;
        }
        if (uVar16 < uVar17) {
          uVar17 = uVar16;
        }
        uVar14 = (uint16_t)uVar17;
        if ((int)uVar16 < 0) {
          uVar14 = 0;
        }
        *output = uVar14;
        output = output + 1;
        iVar8 = iVar8 + 1;
        uVar10 = uVar10 + uVar13;
      } while (iVar8 != out_length);
    }
  }
  else {
    if (iVar18 != 0) {
      iVar8 = 0;
      do {
        lVar12 = 0;
        iVar11 = 0;
        do {
          uVar16 = ((int)uVar10 >> 0xe) + -3 + (int)lVar12;
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          iVar11 = iVar11 + (uint)input[uVar16] *
                            (int)*(short *)((long)*local_48 +
                                           lVar12 * 2 + (ulong)(uVar10 >> 4 & 0x3f0));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 8);
        uVar16 = iVar11 + 0x40 >> 7;
        if (bd == 10) {
          uVar17 = 0x3ff;
          if (uVar16 < 0x3ff) {
            uVar17 = uVar16;
          }
        }
        else {
          if (bd == 0xc) {
            uVar9 = 0xfff;
            uVar17 = 0xfff;
          }
          else {
            uVar9 = 0xff;
            uVar17 = 0xff;
          }
          if (uVar16 < uVar9) {
            uVar17 = uVar16;
          }
        }
        uVar14 = (uint16_t)uVar17;
        if ((int)uVar16 < 0) {
          uVar14 = 0;
        }
        *output = uVar14;
        output = output + 1;
        iVar8 = iVar8 + 1;
        uVar10 = uVar10 + uVar13;
      } while (iVar8 != iVar18);
    }
    do {
      lVar19 = -3;
      lVar12 = 0;
      iVar8 = 0;
      iVar11 = 0;
      iVar21 = 0;
      iVar22 = 0;
      do {
        uVar1 = *(ulong *)((long)*local_48 + lVar12 * 2 + (ulong)(uVar10 >> 4 & 0x3f0));
        uVar27 = (undefined2)(uVar1 >> 0x30);
        auVar25._8_4_ = 0;
        auVar25._0_8_ = uVar1;
        auVar25._12_2_ = uVar27;
        auVar25._14_2_ = uVar27;
        uVar27 = (undefined2)(uVar1 >> 0x20);
        auVar24._12_4_ = auVar25._12_4_;
        auVar24._8_2_ = 0;
        auVar24._0_8_ = uVar1;
        auVar24._10_2_ = uVar27;
        auVar23._10_6_ = auVar24._10_6_;
        auVar23._8_2_ = uVar27;
        auVar23._0_8_ = uVar1;
        uVar27 = (undefined2)(uVar1 >> 0x10);
        auVar6._4_8_ = auVar23._8_8_;
        auVar6._2_2_ = uVar27;
        auVar6._0_2_ = uVar27;
        auVar26._4_4_ = auVar6._0_4_ >> 0x10;
        auVar26._12_4_ = auVar24._12_4_ >> 0x10;
        uVar2 = *(ulong *)(input + ((int)uVar10 >> 0xe) + lVar19);
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar2;
        auVar3._12_2_ = (short)(uVar2 >> 0x30);
        auVar4._8_2_ = (short)(uVar2 >> 0x20);
        auVar4._0_8_ = uVar2;
        auVar4._10_4_ = auVar3._10_4_;
        auVar7._6_8_ = 0;
        auVar7._0_6_ = auVar4._8_6_;
        auVar5._4_2_ = (short)(uVar2 >> 0x10);
        auVar5._0_4_ = (uint)uVar2;
        auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        iVar8 = iVar8 + ((uint)uVar2 & 0xffff) * (int)(short)uVar1;
        iVar11 = iVar11 + auVar26._4_4_ * auVar5._4_4_;
        iVar21 = iVar21 + (int)(((ulong)auVar4._8_6_ & 0xffffffff) *
                               (ulong)(uint)(auVar23._8_4_ >> 0x10));
        iVar22 = iVar22 + (int)((auVar26._8_8_ & 0xffffffff) * (ulong)(auVar3._10_4_ >> 0x10));
        lVar12 = lVar12 + 4;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 5);
      uVar16 = iVar22 + iVar11 + iVar21 + iVar8 + 0x40 >> 7;
      if (bd == 10) {
        uVar17 = 0x3ff;
        if (uVar16 < 0x3ff) {
          uVar17 = uVar16;
        }
      }
      else {
        if (bd == 0xc) {
          uVar9 = 0xfff;
          uVar17 = 0xfff;
        }
        else {
          uVar9 = 0xff;
          uVar17 = 0xff;
        }
        if (uVar16 < uVar9) {
          uVar17 = uVar16;
        }
      }
      uVar14 = (uint16_t)uVar17;
      if ((int)uVar16 < 0) {
        uVar14 = 0;
      }
      *output = uVar14;
      output = output + 1;
      uVar10 = uVar10 + uVar13;
      bVar20 = iVar18 != iVar15;
      iVar18 = iVar18 + 1;
    } while (bVar20);
    iVar15 = iVar15 + 1;
    if (iVar15 < out_length) {
      do {
        lVar12 = 0;
        iVar8 = 0;
        do {
          iVar18 = ((int)uVar10 >> 0xe) + -3 + (int)lVar12;
          if (in_length + -1 <= iVar18) {
            iVar18 = in_length + -1;
          }
          iVar8 = iVar8 + (uint)input[iVar18] *
                          (int)*(short *)((long)*local_48 +
                                         lVar12 * 2 + (ulong)(uVar10 >> 4 & 0x3f0));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 8);
        uVar16 = iVar8 + 0x40 >> 7;
        if (bd == 10) {
          uVar17 = 0x3ff;
          if (uVar16 < 0x3ff) {
            uVar17 = uVar16;
          }
        }
        else {
          if (bd == 0xc) {
            uVar9 = 0xfff;
            uVar17 = 0xfff;
          }
          else {
            uVar9 = 0xff;
            uVar17 = 0xff;
          }
          if (uVar16 < uVar9) {
            uVar17 = uVar16;
          }
        }
        uVar14 = (uint16_t)uVar17;
        if ((int)uVar16 < 0) {
          uVar14 = 0;
        }
        *output = uVar14;
        output = output + 1;
        iVar15 = iVar15 + 1;
        uVar10 = uVar10 + uVar13;
      } while (iVar15 != out_length);
    }
  }
  return;
}

Assistant:

static void highbd_interpolate(const uint16_t *const input, int in_length,
                               uint16_t *output, int out_length, int bd) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  highbd_interpolate_core(input, in_length, output, out_length, bd,
                          &interp_filters[0][0], SUBPEL_TAPS);
}